

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Segment::ParseNext
          (Segment *this,Cluster *pCurr,Cluster **pResult,longlong *pos,long *len)

{
  int iVar1;
  Cluster *pCVar2;
  IMkvReader *pIVar3;
  longlong lVar4;
  long *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  Segment *in_RDI;
  long *in_R8;
  long status_1;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong result_1;
  longlong segment_stop;
  long status;
  longlong avail;
  longlong total;
  long result;
  long next_idx;
  long *in_stack_000000b0;
  longlong *in_stack_000000b8;
  Cluster **in_stack_000000c0;
  Segment *in_stack_000000c8;
  long local_98;
  long *in_stack_ffffffffffffff78;
  Segment *in_stack_ffffffffffffff80;
  IMkvReader *in_stack_ffffffffffffff88;
  longlong in_stack_ffffffffffffff90;
  long local_50;
  undefined1 local_48 [8];
  long local_40;
  long local_38;
  long *local_30;
  long *local_28;
  undefined8 *local_20;
  long local_18;
  long local_8;
  
  *in_RDX = 0;
  if (*(long *)(in_RSI + 0x10) < 0) {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_18 = in_RSI;
    iVar1 = (*in_RDI->m_pReader->_vptr_IMkvReader[1])(in_RDI->m_pReader,local_48,&local_50);
    local_8 = (long)iVar1;
    if (-1 < local_8) {
      if (in_RDI->m_size < 0) {
        local_98 = -1;
      }
      else {
        local_98 = in_RDI->m_start + in_RDI->m_size;
      }
      *local_28 = *(long *)(local_18 + 8);
      if (*(long *)(local_18 + 0x20) < 0) {
        if (local_50 < *local_28 + 1) {
          *local_30 = 1;
          return -3;
        }
        pIVar3 = (IMkvReader *)
                 GetUIntLength(in_stack_ffffffffffffff88,(longlong)in_stack_ffffffffffffff80,
                               in_stack_ffffffffffffff78);
        if ((long)pIVar3 < 0) {
          return (long)pIVar3;
        }
        if (0 < (long)pIVar3) {
          return -3;
        }
        if ((-1 < local_98) && (local_98 < *local_28 + *local_30)) {
          return -2;
        }
        if (local_50 < *local_28 + *local_30) {
          return -3;
        }
        lVar4 = ReadUInt(pIVar3,in_stack_ffffffffffffff90,(long *)in_stack_ffffffffffffff88);
        if (lVar4 != 0x1f43b675) {
          return -1;
        }
        *local_28 = *local_30 + *local_28;
        if (local_50 < *local_28 + 1) {
          *local_30 = 1;
          return -3;
        }
        pIVar3 = (IMkvReader *)
                 GetUIntLength(in_stack_ffffffffffffff88,(longlong)in_stack_ffffffffffffff80,
                               in_stack_ffffffffffffff78);
        if ((long)pIVar3 < 0) {
          return (long)pIVar3;
        }
        if (0 < (long)pIVar3) {
          return -3;
        }
        if ((-1 < local_98) && (local_98 < *local_28 + *local_30)) {
          return -2;
        }
        if (local_50 < *local_28 + *local_30) {
          return -3;
        }
        lVar4 = ReadUInt(pIVar3,lVar4,(long *)in_stack_ffffffffffffff88);
        if (lVar4 < 0) {
          return lVar4;
        }
        *local_28 = *local_30 + *local_28;
        if (lVar4 == (1L << ((char)*local_30 * '\a' & 0x3fU)) + -1) {
          return -2;
        }
        if ((-1 < local_98) && (local_98 < lVar4 + *local_28)) {
          return -2;
        }
        *local_28 = lVar4 + *local_28;
        if ((-1 < local_98) && (local_98 < *local_28)) {
          return -2;
        }
      }
      else {
        *local_28 = *(long *)(local_18 + 0x20) + *local_28;
      }
      do {
        local_8 = DoParseNext(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                              in_stack_000000b0);
      } while (1 < local_8);
    }
  }
  else {
    local_38 = *(long *)(in_RSI + 0x10) + 1;
    if (local_38 < in_RDI->m_clusterCount) {
      *in_RDX = in_RDI->m_clusters[local_38];
      local_8 = 0;
    }
    else {
      local_20 = in_RDX;
      local_40 = LoadCluster(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(long *)in_RDI);
      local_8 = local_40;
      if (-1 < local_40) {
        if (local_40 < 1) {
          pCVar2 = GetLast(in_RDI);
          *local_20 = pCVar2;
          local_8 = 0;
        }
        else {
          local_8 = 1;
        }
      }
    }
  }
  return local_8;
}

Assistant:

long Segment::ParseNext(const Cluster* pCurr, const Cluster*& pResult,
                        long long& pos, long& len) {
  assert(pCurr);
  assert(!pCurr->EOS());
  assert(m_clusters);

  pResult = 0;

  if (pCurr->m_index >= 0) {  // loaded (not merely preloaded)
    assert(m_clusters[pCurr->m_index] == pCurr);

    const long next_idx = pCurr->m_index + 1;

    if (next_idx < m_clusterCount) {
      pResult = m_clusters[next_idx];
      return 0;  // success
    }

    // curr cluster is last among loaded

    const long result = LoadCluster(pos, len);

    if (result < 0)  // error or underflow
      return result;

    if (result > 0)  // no more clusters
    {
      // pResult = &m_eos;
      return 1;
    }

    pResult = GetLast();
    return 0;  // success
  }

  assert(m_pos > 0);

  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // interrogate curr cluster

  pos = pCurr->m_element_start;

  if (pCurr->m_element_size >= 0)
    pos += pCurr->m_element_size;
  else {
    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadUInt(m_pReader, pos, len);

    if (id != libwebm::kMkvCluster)
      return -1;

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)  // TODO: should never happen
      return E_FILE_FORMAT_INVALID;  // TODO: resolve this

    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    if ((segment_stop >= 0) && ((pos + size) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    // Pos now points to start of payload

    pos += size;  // consume payload (that is, the current cluster)
    if (segment_stop >= 0 && pos > segment_stop)
      return E_FILE_FORMAT_INVALID;

    // By consuming the payload, we are assuming that the curr
    // cluster isn't interesting.  That is, we don't bother checking
    // whether the payload of the curr cluster is less than what
    // happens to be available (obtained via IMkvReader::Length).
    // Presumably the caller has already dispensed with the current
    // cluster, and really does want the next cluster.
  }

  // pos now points to just beyond the last fully-loaded cluster

  for (;;) {
    const long status = DoParseNext(pResult, pos, len);

    if (status <= 1)
      return status;
  }
}